

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O2

void cvAdjustOrder(CVodeMem cv_mem,int deltaq)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  sunrealtype *psVar4;
  undefined1 auVar5 [16];
  long lVar6;
  ulong uVar7;
  sunrealtype *psVar8;
  ulong uVar9;
  N_Vector *pp_Var10;
  int iVar11;
  long lVar12;
  N_Vector **ppp_Var13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  undefined4 local_28;
  
  iVar11 = cv_mem->cv_q;
  lVar6 = (long)iVar11;
  if (deltaq == 1 || lVar6 != 2) {
    if (cv_mem->cv_lmm == 2) {
      if (deltaq == -1) {
        iVar14 = -1;
        if (-1 < cv_mem->cv_qmax) {
          iVar14 = cv_mem->cv_qmax;
        }
        for (lVar12 = 0; (long)iVar14 + 1 != lVar12; lVar12 = lVar12 + 1) {
          cv_mem->cv_l[lVar12] = 0.0;
        }
        cv_mem->cv_l[2] = 1.0;
        psVar8 = cv_mem->cv_l + 3;
        dVar23 = 0.0;
        iVar14 = 3;
        for (lVar12 = 1; lVar12 <= iVar11 + -2; lVar12 = lVar12 + 1) {
          dVar23 = dVar23 + cv_mem->cv_tau[lVar12];
          dVar21 = cv_mem->cv_hscale;
          for (lVar15 = 0; 1 < iVar14 + (int)lVar15; lVar15 = lVar15 + -1) {
            psVar8[lVar15] = psVar8[lVar15] * (dVar23 / dVar21) + psVar8[lVar15 + -1];
          }
          iVar14 = iVar14 + 1;
          psVar8 = psVar8 + 1;
        }
        if (2 < iVar11) {
          for (lVar12 = 0; lVar6 + -2 != lVar12; lVar12 = lVar12 + 1) {
            uVar3 = *(uint *)((long)(cv_mem->cv_l + lVar12 + 2) + 4);
            psVar8 = cv_mem->cv_cvals;
            *(undefined4 *)(psVar8 + lVar12) = *(undefined4 *)(cv_mem->cv_l + lVar12 + 2);
            *(uint *)((long)(psVar8 + lVar12) + 4) = uVar3 ^ 0x80000000;
          }
          N_VScaleAddMulti(iVar11 + -2,cv_mem->cv_cvals,cv_mem->cv_zn[lVar6],cv_mem->cv_zn + 2,
                           cv_mem->cv_zn + 2);
          if (cv_mem->cv_quadr != 0) {
            N_VScaleAddMulti(cv_mem->cv_q + -2,cv_mem->cv_cvals,cv_mem->cv_znQ[cv_mem->cv_q],
                             cv_mem->cv_znQ + 2,cv_mem->cv_znQ + 2);
          }
          if (cv_mem->cv_sensi != 0) {
            N_VScaleAddMultiVectorArray
                      (cv_mem->cv_Ns,cv_mem->cv_q + -2,cv_mem->cv_cvals,cv_mem->cv_znS[cv_mem->cv_q]
                       ,cv_mem->cv_znS + 2,cv_mem->cv_znS + 2);
          }
          if (cv_mem->cv_quadr_sensi != 0) {
            iVar11 = cv_mem->cv_Ns;
            iVar14 = cv_mem->cv_q + -2;
            psVar8 = cv_mem->cv_cvals;
            pp_Var10 = cv_mem->cv_znQS[cv_mem->cv_q];
            ppp_Var13 = cv_mem->cv_znQS + 2;
LAB_0011e5c7:
            N_VScaleAddMultiVectorArray(iVar11,iVar14,psVar8,pp_Var10,ppp_Var13,ppp_Var13);
            return;
          }
        }
      }
      else if (deltaq == 1) {
        iVar14 = -1;
        if (-1 < cv_mem->cv_qmax) {
          iVar14 = cv_mem->cv_qmax;
        }
        for (lVar12 = 0; (long)iVar14 + 1 != lVar12; lVar12 = lVar12 + 1) {
          cv_mem->cv_l[lVar12] = 0.0;
        }
        cv_mem->cv_l[2] = 1.0;
        auVar5 = _DAT_00134760;
        if (iVar11 < 2) {
          dVar21 = 1.0;
          dVar18 = -1.0;
          dVar23 = 1.0;
        }
        else {
          dVar1 = cv_mem->cv_hscale;
          psVar8 = cv_mem->cv_l + 3;
          dVar21 = 1.0;
          dVar18 = -1.0;
          dVar23 = 1.0;
          iVar11 = 3;
          lVar12 = 1;
          dVar20 = 1.0;
          dVar19 = dVar1;
          while (lVar12 != lVar6) {
            dVar2 = cv_mem->cv_tau[lVar12 + 1];
            lVar12 = lVar12 + 1;
            for (lVar15 = 0; 1 < iVar11 + (int)lVar15; lVar15 = lVar15 + -1) {
              psVar8[lVar15] = psVar8[lVar15] * dVar20 + psVar8[lVar15 + -1];
            }
            dVar19 = dVar19 + dVar2;
            dVar20 = dVar19 / dVar1;
            auVar22._8_8_ = (double)(int)lVar12;
            auVar22._0_8_ = dVar20;
            auVar22 = divpd(auVar5,auVar22);
            dVar23 = dVar23 * dVar20;
            dVar21 = dVar21 + auVar22._0_8_;
            dVar18 = dVar18 - auVar22._8_8_;
            iVar11 = iVar11 + 1;
            psVar8 = psVar8 + 1;
          }
        }
        psVar8 = cv_mem->cv_l + 2;
        dVar23 = (-dVar18 - dVar21) / dVar23;
        N_VScale(cv_mem->cv_zn[cv_mem->cv_indx_acor],cv_mem->cv_zn[cv_mem->cv_L]);
        if (1 < cv_mem->cv_q) {
          N_VScaleAddMulti(cv_mem->cv_q + -1,psVar8,cv_mem->cv_zn[cv_mem->cv_L],cv_mem->cv_zn + 2,
                           cv_mem->cv_zn + 2);
        }
        local_28 = SUB84(dVar23,0);
        if (cv_mem->cv_quadr != 0) {
          N_VScale(local_28,cv_mem->cv_znQ[cv_mem->cv_indx_acor],cv_mem->cv_znQ[cv_mem->cv_L]);
          if (1 < cv_mem->cv_q) {
            N_VScaleAddMulti(cv_mem->cv_q + -1,psVar8,cv_mem->cv_znQ[cv_mem->cv_L],
                             cv_mem->cv_znQ + 2,cv_mem->cv_znQ + 2);
          }
        }
        if (cv_mem->cv_sensi != 0) {
          uVar3 = cv_mem->cv_Ns;
          uVar7 = 0;
          uVar9 = 0;
          if (0 < (int)uVar3) {
            uVar9 = (ulong)uVar3;
          }
          psVar4 = cv_mem->cv_cvals;
          for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
            psVar4[uVar7] = dVar23;
          }
          N_VScaleVectorArray(uVar3,psVar4,cv_mem->cv_znS[cv_mem->cv_indx_acor],
                              cv_mem->cv_znS[cv_mem->cv_L]);
          if (1 < cv_mem->cv_q) {
            N_VScaleAddMultiVectorArray
                      (cv_mem->cv_Ns,cv_mem->cv_q + -1,psVar8,cv_mem->cv_znS[cv_mem->cv_L],
                       cv_mem->cv_znS + 2,cv_mem->cv_znS + 2);
          }
        }
        if (cv_mem->cv_quadr_sensi != 0) {
          uVar3 = cv_mem->cv_Ns;
          uVar7 = 0;
          uVar9 = 0;
          if (0 < (int)uVar3) {
            uVar9 = (ulong)uVar3;
          }
          psVar4 = cv_mem->cv_cvals;
          for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
            psVar4[uVar7] = dVar23;
          }
          N_VScaleVectorArray(uVar3,psVar4,cv_mem->cv_znQS[cv_mem->cv_indx_acor],
                              cv_mem->cv_znQS[cv_mem->cv_L]);
          if (1 < cv_mem->cv_q) {
            iVar11 = cv_mem->cv_Ns;
            iVar14 = cv_mem->cv_q + -1;
            pp_Var10 = cv_mem->cv_znQS[cv_mem->cv_L];
            ppp_Var13 = cv_mem->cv_znQS + 2;
            goto LAB_0011e5c7;
          }
        }
      }
    }
    else if (cv_mem->cv_lmm == 1) {
      if (deltaq == 1) {
        N_VConst(0,cv_mem->cv_zn[cv_mem->cv_L]);
        if (cv_mem->cv_quadr != 0) {
          N_VConst(0,cv_mem->cv_znQ[cv_mem->cv_L]);
        }
        if (cv_mem->cv_sensi != 0) {
          N_VConstVectorArray(0,cv_mem->cv_Ns,cv_mem->cv_znS[cv_mem->cv_L]);
          return;
        }
      }
      else {
        iVar14 = -1;
        if (-1 < cv_mem->cv_qmax) {
          iVar14 = cv_mem->cv_qmax;
        }
        for (lVar12 = 0; (long)iVar14 + 1 != lVar12; lVar12 = lVar12 + 1) {
          cv_mem->cv_l[lVar12] = 0.0;
        }
        cv_mem->cv_l[1] = 1.0;
        lVar16 = lVar6 + -2;
        psVar8 = cv_mem->cv_l + 2;
        dVar23 = 0.0;
        lVar12 = 2;
        for (lVar15 = 1; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
          dVar23 = dVar23 + cv_mem->cv_tau[lVar15];
          dVar21 = cv_mem->cv_hscale;
          for (lVar17 = 0; 0 < lVar12 + lVar17; lVar17 = lVar17 + -1) {
            psVar8[lVar17] = psVar8[lVar17] * (dVar23 / dVar21) + psVar8[lVar17 + -1];
          }
          lVar12 = lVar12 + 1;
          psVar8 = psVar8 + 1;
        }
        for (lVar12 = 0x99; lVar12 + -0x98 <= lVar16; lVar12 = lVar12 + 1) {
          (&cv_mem->cv_sunctx)[lVar12] =
               (SUNContext)
               ((*(double *)((long)cv_mem + lVar12 * 8 + -8) / (double)((int)lVar12 + -0x97)) *
               (double)iVar11);
        }
        if (2 < iVar11) {
          for (lVar12 = 0; lVar16 != lVar12; lVar12 = lVar12 + 1) {
            uVar3 = *(uint *)((long)(cv_mem->cv_l + lVar12 + 2) + 4);
            psVar8 = cv_mem->cv_cvals;
            *(undefined4 *)(psVar8 + lVar12) = *(undefined4 *)(cv_mem->cv_l + lVar12 + 2);
            *(uint *)((long)(psVar8 + lVar12) + 4) = uVar3 ^ 0x80000000;
          }
          N_VScaleAddMulti(lVar16,cv_mem->cv_cvals,cv_mem->cv_zn[lVar6],cv_mem->cv_zn + 2,
                           cv_mem->cv_zn + 2);
          if (cv_mem->cv_quadr != 0) {
            N_VScaleAddMulti(cv_mem->cv_q + -2,cv_mem->cv_cvals,cv_mem->cv_znQ[cv_mem->cv_q],
                             cv_mem->cv_znQ + 2,cv_mem->cv_znQ + 2);
          }
          if (cv_mem->cv_sensi != 0) {
            iVar11 = cv_mem->cv_Ns;
            iVar14 = cv_mem->cv_q + -2;
            psVar8 = cv_mem->cv_cvals;
            pp_Var10 = cv_mem->cv_znS[cv_mem->cv_q];
            ppp_Var13 = cv_mem->cv_znS + 2;
            goto LAB_0011e5c7;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void cvAdjustOrder(CVodeMem cv_mem, int deltaq)
{
  if ((cv_mem->cv_q == 2) && (deltaq != 1)) { return; }

  switch (cv_mem->cv_lmm)
  {
  case CV_ADAMS: cvAdjustAdams(cv_mem, deltaq); break;
  case CV_BDF: cvAdjustBDF(cv_mem, deltaq); break;
  }
}